

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_vector.cpp
# Opt level: O0

bool fill_review(Review *r)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  Review *r_local;
  
  std::operator<<((ostream *)&std::cout,"\nEnter book title (q to quit): ");
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,(string *)r);
  bVar1 = std::operator==(&r->title,"q");
  if (bVar1) {
    r_local._7_1_ = false;
  }
  else {
    std::operator<<((ostream *)&std::cout,"Enter book rating: ");
    std::istream::operator>>(&std::cin,&r->rating);
    uVar3 = std::ios::operator!((ios *)((long)&std::cin + *(long *)(std::cin + -0x18)));
    if ((uVar3 & 1) == 0) {
      do {
        iVar2 = std::istream::get();
      } while (iVar2 != 10);
      r_local._7_1_ = true;
    }
    else {
      r_local._7_1_ = false;
    }
  }
  return r_local._7_1_;
}

Assistant:

bool fill_review(Review & r) {
    std::cout << "\nEnter book title (q to quit): ";
    std::getline(std::cin, r.title);
    if (r.title == "q") {
        return false;
    }
    std::cout << "Enter book rating: ";
    std::cin >> r.rating;

    if (!std::cin) {
        return false;
    }
    //  get rid of rest of input line
    while(std::cin.get() != '\n') {
        continue;
    }
    return true;
}